

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool __thiscall google::protobuf::io::Tokenizer::Next(Tokenizer *this)

{
  ColumnNumber CVar1;
  bool bVar2;
  undefined1 uVar3;
  NextCommentStatus NVar4;
  
  (this->previous_).type = (this->current_).type;
  std::__cxx11::string::_M_assign((string *)&(this->previous_).text);
  (this->previous_).end_column = (this->current_).end_column;
  CVar1 = (this->current_).column;
  (this->previous_).line = (this->current_).line;
  (this->previous_).column = CVar1;
  if (this->read_error_ == false) {
    (this->current_).type = TYPE_START;
    (this->current_).text._M_string_length = 0;
    *(this->current_).text._M_dataplus._M_p = '\0';
    CVar1 = this->column_;
    (this->current_).line = this->line_;
    (this->current_).column = CVar1;
    this->record_target_ = &(this->current_).text;
    this->record_start_ = this->buffer_pos_;
    bVar2 = TryConsumeWhitespace(this);
    if (bVar2) {
      if (this->buffer_pos_ != this->record_start_) {
        std::__cxx11::string::append
                  ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
      }
      this->record_target_ = (string *)0x0;
      this->record_start_ = -1;
      (this->current_).end_column = this->column_;
    }
    else {
      if (this->report_whitespace_ == true) {
        bVar2 = false;
        if ((this->report_newlines_ == true) && (bVar2 = false, this->current_char_ == '\n')) {
          NextChar(this);
          (this->current_).type = TYPE_NEWLINE;
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
      }
      if (this->buffer_pos_ != this->record_start_) {
        std::__cxx11::string::append
                  ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
      }
      this->record_target_ = (string *)0x0;
      this->record_start_ = -1;
      (this->current_).end_column = this->column_;
      if (!bVar2) {
        NVar4 = TryConsumeCommentStart(this);
        uVar3 = (*(code *)(&DAT_01436f70 + *(int *)(&DAT_01436f70 + (ulong)NVar4 * 4)))();
        return (bool)uVar3;
      }
    }
    bVar2 = true;
  }
  else {
    (this->current_).type = TYPE_END;
    (this->current_).text._M_string_length = 0;
    *(this->current_).text._M_dataplus._M_p = '\0';
    CVar1 = this->column_;
    (this->current_).line = this->line_;
    (this->current_).column = CVar1;
    (this->current_).end_column = CVar1;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Tokenizer::Next() {
  previous_ = current_;

  while (!read_error_) {
    StartToken();
    bool report_token = TryConsumeWhitespace() || TryConsumeNewline();
    EndToken();
    if (report_token) {
      return true;
    }

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(nullptr);
        continue;
      case BLOCK_COMMENT:
        ConsumeBlockComment(nullptr);
        continue;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        break;
    }

    // Check for EOF before continuing.
    if (read_error_) break;

    if (LookingAt<Unprintable>() || current_char_ == '\0') {
      AddError("Invalid control characters encountered in text.");
      NextChar();
      // Skip more unprintable characters, too.  But, remember that '\0' is
      // also what current_char_ is set to after EOF / read error.  We have
      // to be careful not to go into an infinite loop of trying to consume
      // it, so make sure to check read_error_ explicitly before consuming
      // '\0'.
      while (TryConsumeOne<Unprintable>() ||
             (!read_error_ && TryConsume('\0'))) {
        // Ignore.
      }

    } else {
      // Reading some sort of token.
      StartToken();

      if (TryConsumeOne<Letter>()) {
        ConsumeZeroOrMore<Alphanumeric>();
        current_.type = TYPE_IDENTIFIER;
      } else if (TryConsume('0')) {
        current_.type = ConsumeNumber(true, false);
      } else if (TryConsume('.')) {
        // This could be the beginning of a floating-point number, or it could
        // just be a '.' symbol.

        if (TryConsumeOne<Digit>()) {
          // It's a floating-point number.
          if (previous_.type == TYPE_IDENTIFIER &&
              current_.line == previous_.line &&
              current_.column == previous_.end_column) {
            // We don't accept syntax like "blah.123".
            error_collector_->RecordError(
                line_, column_ - 2,
                "Need space between identifier and decimal point.");
          }
          current_.type = ConsumeNumber(false, true);
        } else {
          current_.type = TYPE_SYMBOL;
        }
      } else if (TryConsumeOne<Digit>()) {
        current_.type = ConsumeNumber(false, false);
      } else if (TryConsume('\"')) {
        ConsumeString('\"');
        current_.type = TYPE_STRING;
      } else if (TryConsume('\'')) {
        ConsumeString('\'');
        current_.type = TYPE_STRING;
      } else {
        // Check if the high order bit is set.
        if (current_char_ & 0x80) {
          error_collector_->RecordError(
              line_, column_,
              absl::StrFormat("Interpreting non ascii codepoint %d.",
                              static_cast<unsigned char>(current_char_)));
        }
        NextChar();
        current_.type = TYPE_SYMBOL;
      }

      EndToken();
      return true;
    }
  }

  // EOF
  current_.type = TYPE_END;
  current_.text.clear();
  current_.line = line_;
  current_.column = column_;
  current_.end_column = column_;
  return false;
}